

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O0

void mcpl_internal_serialise_particle_to_buffer(mcpl_particle_t *particle,mcpl_outfileinternal_t *f)

{
  uint uVar1;
  long lVar2;
  long in_RSI;
  double *in_RDI;
  int i;
  char *pbuf;
  uint ibuf;
  double dirsq;
  double pack_ekindir [3];
  int local_44;
  uint local_34;
  double local_28 [2];
  ulong local_18;
  long local_10;
  double *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (1e-05 < ABS((in_RDI[9] * in_RDI[9] + in_RDI[7] * in_RDI[7] + in_RDI[8] * in_RDI[8]) - 1.0)) {
    mcpl_error((char *)0x102d07);
  }
  if (*local_8 <= 0.0 && *local_8 != 0.0) {
    mcpl_error((char *)0x102d21);
  }
  mcpl_unitvect_pack_adaptproj(local_8 + 7,local_28);
  local_18 = (ulong)ABS(*local_8) | local_18 & 0x8000000000000000;
  local_34 = 0;
  lVar2 = local_10 + 0x84;
  if (*(int *)(local_10 + 0x50) == 0) {
    if (*(int *)(local_10 + 0x4c) != 0) {
      for (local_44 = 0; local_44 < 3; local_44 = local_44 + 1) {
        *(double *)(lVar2 + (ulong)local_34) = local_8[(long)local_44 + 1];
        local_34 = local_34 + 8;
      }
    }
    for (local_44 = 0; local_44 < 3; local_44 = local_44 + 1) {
      *(double *)(lVar2 + (ulong)local_34) = local_8[(long)local_44 + 4];
      local_34 = local_34 + 8;
    }
    for (local_44 = 0; local_44 < 3; local_44 = local_44 + 1) {
      *(double *)(lVar2 + (ulong)local_34) = local_28[local_44];
      local_34 = local_34 + 8;
    }
    *(double *)(lVar2 + (ulong)local_34) = local_8[10];
    uVar1 = local_34 + 8;
    if ((*(double *)(local_10 + 0x58) == 0.0) && (!NAN(*(double *)(local_10 + 0x58)))) {
      *(double *)(lVar2 + (ulong)uVar1) = local_8[0xb];
      uVar1 = local_34 + 0x10;
    }
  }
  else {
    if (*(int *)(local_10 + 0x4c) != 0) {
      for (local_44 = 0; local_44 < 3; local_44 = local_44 + 1) {
        *(float *)(lVar2 + (ulong)local_34) = (float)local_8[(long)local_44 + 1];
        local_34 = local_34 + 4;
      }
    }
    for (local_44 = 0; local_44 < 3; local_44 = local_44 + 1) {
      *(float *)(lVar2 + (ulong)local_34) = (float)local_8[(long)local_44 + 4];
      local_34 = local_34 + 4;
    }
    for (local_44 = 0; local_44 < 3; local_44 = local_44 + 1) {
      *(float *)(lVar2 + (ulong)local_34) = (float)local_28[local_44];
      local_34 = local_34 + 4;
    }
    *(float *)(lVar2 + (ulong)local_34) = (float)local_8[10];
    uVar1 = local_34 + 4;
    if ((*(double *)(local_10 + 0x58) == 0.0) && (!NAN(*(double *)(local_10 + 0x58)))) {
      *(float *)(lVar2 + (ulong)uVar1) = (float)local_8[0xb];
      uVar1 = local_34 + 8;
    }
  }
  local_34 = uVar1;
  if (*(int *)(local_10 + 0x54) == 0) {
    *(undefined4 *)(lVar2 + (ulong)local_34) = *(undefined4 *)(local_8 + 0xc);
    local_34 = local_34 + 4;
  }
  if (*(int *)(local_10 + 0x48) != 0) {
    *(undefined4 *)(lVar2 + (ulong)local_34) = *(undefined4 *)((long)local_8 + 100);
  }
  return;
}

Assistant:

MCPL_LOCAL void mcpl_internal_serialise_particle_to_buffer( const mcpl_particle_t* particle,
                                                            mcpl_outfileinternal_t * f ) {

  //Serialise the provided particle into the particle_buffer of the output file
  //(according to the settings of the output file).

  double pack_ekindir[3];

  //Sanity check (add more??):
  double dirsq = particle->direction[0] * particle->direction[0]
    + particle->direction[1] * particle->direction[1]
    + particle->direction[2] * particle->direction[2];
  if (fabs(dirsq-1.0)>1.0e-5)
    mcpl_error("attempting to add particle with non-unit direction vector");
  if (particle->ekin<0.0)
    mcpl_error("attempting to add particle with negative kinetic energy");
  //direction and ekin are packed into 3 doubles:
  mcpl_unitvect_pack_adaptproj(particle->direction,pack_ekindir);
  //pack_ekindir[2] is now just a sign(1.0 or -1.0), so we can store the
  //ekin in that field as well (since it must be non-negative). We use copysign
  //to be sure the signbit is set also if ekin=0:
  pack_ekindir[2] = copysign(particle->ekin,pack_ekindir[2]);

  //serialise particle object to buffer:
  unsigned ibuf = 0;
  char * pbuf = &(f->particle_buffer[0]);
  int i;
  if (f->opt_singleprec) {
    if (f->opt_polarisation) {
      for (i=0;i<3;++i) {
        *(float*)&pbuf[ibuf] = (float)particle->polarisation[i];
        ibuf += sizeof(float);
      }
    }
    for (i=0;i<3;++i) {
      *(float*)&pbuf[ibuf] = (float)particle->position[i];
      ibuf += sizeof(float);
    }
    for (i=0;i<3;++i) {
      *(float*)&pbuf[ibuf] = (float)pack_ekindir[i];
      ibuf += sizeof(float);
    }
    *(float*)&pbuf[ibuf] = (float)particle->time;
    ibuf += sizeof(float);
    if (!f->opt_universalweight) {
      *(float*)&pbuf[ibuf] = (float)particle->weight;
      ibuf += sizeof(float);
    }
  } else {
    if (f->opt_polarisation) {
      for (i=0;i<3;++i) {
        *(double*)&pbuf[ibuf] = particle->polarisation[i];
        ibuf += sizeof(double);
      }
    }
    for (i=0;i<3;++i) {
      *(double*)&pbuf[ibuf] = particle->position[i];
      ibuf += sizeof(double);
    }
    for (i=0;i<3;++i) {
      *(double*)&pbuf[ibuf] = pack_ekindir[i];
      ibuf += sizeof(double);
    }
    *(double*)&pbuf[ibuf] = particle->time;
    ibuf += sizeof(double);
    if (!f->opt_universalweight) {
      *(double*)&pbuf[ibuf] = particle->weight;
      ibuf += sizeof(double);
    }
  }
  if (!f->opt_universalpdgcode) {
    *(int32_t*)&pbuf[ibuf] = particle->pdgcode;
    ibuf += sizeof(int32_t);
  }
  if (f->opt_userflags) {
    *(uint32_t*)&pbuf[ibuf] = particle->userflags;
#ifndef NDEBUG
    ibuf += sizeof(uint32_t);
#endif
  }
  assert(ibuf==f->particle_size);
}